

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::NullTypeHandlerBase::DeleteProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags flags)

{
  ScriptContext *this_00;
  bool bVar1;
  uint32 in_EAX;
  BOOL BVar2;
  BOOL BVar3;
  uint32 local_38;
  PropertyOperationFlags local_34;
  uint32 indexVal;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  local_38 = in_EAX;
  local_34 = flags;
  bVar1 = DynamicObject::HasObjectArray(instance);
  BVar3 = 1;
  if (bVar1) {
    BVar2 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_38);
    if (BVar2 != 0) {
      BVar3 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,local_38,local_34);
    }
  }
  return BVar3;
}

Assistant:

BOOL NullTypeHandlerBase::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags flags)
    {
        // Check numeric propertyId only if objectArray is available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return DynamicTypeHandler::DeleteItem(instance, indexVal, flags);
        }

        return true;
    }